

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void DD_(PDISASM pMyDisasm)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  Int32 IVar4;
  ulong uVar5;
  char (*__src) [8];
  uint uVar6;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar3 = Security(2,pMyDisasm);
  if (iVar3 == 0) {
    return;
  }
  bVar2 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  __src = RegistersFPU_Masm;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
    __src = RegistersFPU_Nasm;
  }
  if (0xbf < bVar2) {
    uVar6 = (uint)bVar2;
    if ((bVar2 & 0xf0) == 0xe0) {
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      (pMyDisasm->Instruction).Category = 0x2000d;
      if ((uVar6 & 0xf) < 8) {
        builtin_strncpy(pcVar1,"fucom",6);
        strcpy((pMyDisasm->Operand2).OpMnemonic,*__src);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = REGS[0];
        (pMyDisasm->Operand2).OpSize = 0x50;
        uVar5 = (ulong)((uVar6 & 0xf) << 3);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src + uVar5);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = *(Int64 *)((long)REGS + uVar5);
        (pMyDisasm->Operand1).OpSize = 0x50;
        goto LAB_001132c2;
      }
      builtin_strncpy(pcVar1,"fucomp",7);
    }
    else if ((uVar6 & 0xfffffff0) == 0xd0) {
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((bVar2 & 8) == 0) {
        builtin_strncpy(pcVar1,"fst",4);
      }
      else {
        builtin_strncpy(pcVar1,"fstp",5);
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      (pMyDisasm->Instruction).Category = 0x20001;
    }
    else {
      if ((uVar6 & 0xfffffff0) != 0xc0) goto switchD_00112f63_caseD_5;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((bVar2 & 8) == 0) {
        builtin_strncpy(pcVar1,"ffree",6);
        IVar4 = 0x20012;
      }
      else {
        builtin_strncpy(pcVar1,"fxch4",6);
        (pMyDisasm->Operand2).AccessMode = 2;
        IVar4 = 0x20001;
      }
      (pMyDisasm->Instruction).Category = IVar4;
    }
    uVar5 = (ulong)((uVar6 & 7) << 3);
    strcpy((pMyDisasm->Operand1).OpMnemonic,*__src + uVar5);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = *(Int64 *)((long)REGS + uVar5);
LAB_001132b8:
    (pMyDisasm->Operand1).OpSize = 0x50;
    goto LAB_001132c2;
  }
  uVar6 = bVar2 >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = uVar6;
  switch(uVar6) {
  case 0:
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fld",4);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = 1;
    goto LAB_001132b8;
  case 1:
    (pMyDisasm->Reserved_).MemDecoration = 4;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fisttp",7);
    goto LAB_0011322b;
  case 2:
    (pMyDisasm->Reserved_).MemDecoration = 4;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fst",4);
    goto LAB_0011322b;
  case 3:
    (pMyDisasm->Reserved_).MemDecoration = 4;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fstp",5);
LAB_0011322b:
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 0x1000;
    (pMyDisasm->Operand2).Registers.fpu = 1;
    (pMyDisasm->Operand2).OpSize = 0x50;
    break;
  case 4:
    (pMyDisasm->Reserved_).MemDecoration = 0x69;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20012;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"frstor",7);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = 1;
    (pMyDisasm->Operand1).OpSize = 0x360;
    break;
  case 5:
switchD_00112f63_caseD_5:
    failDecode(pMyDisasm);
    break;
  case 6:
    (pMyDisasm->Reserved_).MemDecoration = 5;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20012;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fsave",6);
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 0x1000;
    (pMyDisasm->Operand2).Registers.fpu = 1;
    (pMyDisasm->Operand2).OpSize = 0x360;
    break;
  case 7:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20012;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fstsw",6);
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 0x1000;
    (pMyDisasm->Operand2).OpSize = 0x10;
  }
LAB_001132c2:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ DD_(PDISASM pMyDisasm)
{
    long MyMODRM;
    char (*pRegistersFPU)[8][8] ;

    GV.DECALAGE_EIP = 0;
    if (!Security(2, pMyDisasm)) {return;}
    MyMODRM = *((UInt8*) (GV.EIP_+1));
    pRegistersFPU = &RegistersFPU_Masm;
    if (GV.SYNTAX_ == NasmSyntax) {
        pRegistersFPU = &RegistersFPU_Nasm;
    }
    if (MyMODRM <= 0xbf) {

        GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
        switch(GV.REGOPCODE) {
case 0:
            GV.MemDecoration = Arg2qword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fld");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 1:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 2:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fst");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 3:
            GV.MemDecoration = Arg1qword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 4:
            GV.MemDecoration = Arg2multibytes;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "frstor");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 108*8;
break;
case 6:
            GV.MemDecoration = Arg1multibytes;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fsave");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 108*8;
break;
case 7:
            GV.MemDecoration = Arg1word;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstsw");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.OpSize = 16;
break;
default:
            failDecode(pMyDisasm);
        }
    }
    else {
        if ((MyMODRM & 0xf0) == 0xc0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ffree");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxch4");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand1.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xd0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fst");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand1.OpSize = 80;

        }
        else if ((MyMODRM & 0xf0) == 0xe0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucom");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[0];
                pMyDisasm->Operand2.OpSize = 80;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand1.OpSize = 80;
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomp");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand1.OpSize = 80;
            }

        }

        else {
            failDecode(pMyDisasm);
        }
    }
    GV.EIP_ += GV.DECALAGE_EIP+2;
}